

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O2

MapcodeError myParseMapcodeString(MapcodeElements *mapcodeElements,char *string,Territory territory)

{
  MapcodeError MVar1;
  double lon;
  double lat;
  double dStack_18;
  double local_10;
  
  MVar1 = decodeMapcodeToLatLonUtf8(&local_10,&dStack_18,string,TERRITORY_UNKNOWN,mapcodeElements);
  if ((uint)(MVar1 + ~ERR_BAD_MAPCODE_LENGTH) < 3) {
    MVar1 = ERR_OK;
  }
  return MVar1;
}

Assistant:

static enum MapcodeError myParseMapcodeString(
        MapcodeElements *mapcodeElements,
        const char *string,
        enum Territory territory) {
    double lat, lon;
    enum MapcodeError err = decodeMapcodeToLatLonUtf8(&lat, &lon, string, territory, mapcodeElements);
    // filter out post-parsing errors
    if (err == ERR_MISSING_TERRITORY || err == ERR_MAPCODE_UNDECODABLE || err == ERR_EXTENSION_UNDECODABLE) {
        return ERR_OK;
    }
    return err;
}